

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O3

FT_Error split_sdf_cubic(FT_Memory memory,FT_26D6_Vec *control_points,FT_UInt max_splits,
                        SDF_Edge **out)

{
  FT_Error FVar1;
  ulong uVar2;
  SDF_Edge *pSVar3;
  SDF_Edge_ *pSVar4;
  ulong uVar5;
  FT_Error error;
  FT_26D6_Vec cpos [7];
  FT_Error local_ac;
  FT_26D6_Vec local_a8;
  long local_98;
  long lStack_90;
  long local_88;
  long lStack_80;
  FT_26D6_Vec local_78 [3];
  FT_Pos local_48;
  FT_Pos FStack_40;
  
  if (out == (SDF_Edge **)0x0) {
    return 6;
  }
  local_a8.x = control_points->x;
  local_a8.y = control_points->y;
  local_98 = control_points[1].x;
  lStack_90 = control_points[1].y;
  local_88 = control_points[2].x;
  lStack_80 = control_points[2].y;
  local_78[0].x = control_points[3].x;
  local_78[0].y = control_points[3].y;
  uVar5 = local_a8.x * 2 + local_98 * -3 + local_78[0].x;
  uVar2 = -uVar5;
  if (0 < (long)uVar5) {
    uVar2 = uVar5;
  }
  if (uVar2 < 0x10) {
    uVar5 = local_a8.y * 2 + lStack_90 * -3 + local_78[0].y;
    uVar2 = -uVar5;
    if (0 < (long)uVar5) {
      uVar2 = uVar5;
    }
    if (uVar2 < 0x10) {
      uVar5 = local_a8.x + local_78[0].x * 2 + local_88 * -3;
      uVar2 = -uVar5;
      if (0 < (long)uVar5) {
        uVar2 = uVar5;
      }
      if (uVar2 < 0x10) {
        uVar5 = local_a8.y + local_78[0].y * 2 + lStack_80 * -3;
        uVar2 = -uVar5;
        if (0 < (long)uVar5) {
          uVar2 = uVar5;
        }
        if (uVar2 < 0x10) {
          split_cubic(&local_a8);
          goto LAB_0023f6ee;
        }
      }
    }
  }
  split_cubic(&local_a8);
  if (2 < max_splits) {
    FVar1 = split_sdf_cubic(memory,&local_a8,max_splits >> 1,out);
    if (FVar1 != 0) {
      return FVar1;
    }
    FVar1 = split_sdf_cubic(memory,local_78,max_splits >> 1,out);
    return FVar1;
  }
LAB_0023f6ee:
  local_ac = 0;
  if (memory == (FT_Memory)0x0) {
    local_ac = 6;
  }
  else {
    pSVar3 = (SDF_Edge *)ft_mem_qalloc(memory,0x50,&local_ac);
    if (local_ac == 0) {
      *(undefined8 *)&pSVar3->edge_type = 0;
      pSVar3->next = (SDF_Edge_ *)0x0;
      (pSVar3->control_b).x = 0;
      (pSVar3->control_b).y = 0;
      (pSVar3->control_a).x = 0;
      (pSVar3->control_a).y = 0;
      (pSVar3->end_pos).x = 0;
      (pSVar3->end_pos).y = 0;
      (pSVar3->start_pos).x = 0;
      (pSVar3->start_pos).y = 0;
      local_ac = 0;
      pSVar4 = (SDF_Edge_ *)ft_mem_qalloc(memory,0x50,&local_ac);
      if (local_ac == 0) {
        *(undefined8 *)&pSVar4->edge_type = 0;
        pSVar4->next = (SDF_Edge_ *)0x0;
        (pSVar4->control_b).x = 0;
        (pSVar4->control_b).y = 0;
        (pSVar4->control_a).x = 0;
        (pSVar4->control_a).y = 0;
        (pSVar3->start_pos).x = local_a8.x;
        (pSVar3->start_pos).y = local_a8.y;
        (pSVar3->end_pos).x = local_78[0].x;
        (pSVar3->end_pos).y = local_78[0].y;
        pSVar3->edge_type = SDF_EDGE_LINE;
        (pSVar4->start_pos).x = local_78[0].x;
        (pSVar4->start_pos).y = local_78[0].y;
        (pSVar4->end_pos).x = local_48;
        (pSVar4->end_pos).y = FStack_40;
        pSVar4->edge_type = SDF_EDGE_LINE;
        pSVar3->next = pSVar4;
        pSVar4->next = *out;
        *out = pSVar3;
        local_ac = 0;
      }
    }
  }
  return local_ac;
}

Assistant:

static FT_Error
  split_sdf_cubic( FT_Memory     memory,
                   FT_26D6_Vec*  control_points,
                   FT_UInt       max_splits,
                   SDF_Edge**    out )
  {
    FT_Error       error = FT_Err_Ok;
    FT_26D6_Vec    cpos[7];
    SDF_Edge*      left, *right;
    const FT_26D6  threshold = ONE_PIXEL / 4;


    if ( !memory || !out )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* split the cubic */
    cpos[0] = control_points[0];
    cpos[1] = control_points[1];
    cpos[2] = control_points[2];
    cpos[3] = control_points[3];

    /* If the segment is flat enough we won't get any benefit by */
    /* splitting it further, so we can just stop splitting.      */
    /*                                                           */
    /* Check the deviation of the Bezier curve and stop if it is */
    /* smaller than the pre-defined `threshold` value.           */
    if ( FT_ABS( 2 * cpos[0].x - 3 * cpos[1].x + cpos[3].x ) < threshold &&
         FT_ABS( 2 * cpos[0].y - 3 * cpos[1].y + cpos[3].y ) < threshold &&
         FT_ABS( cpos[0].x - 3 * cpos[2].x + 2 * cpos[3].x ) < threshold &&
         FT_ABS( cpos[0].y - 3 * cpos[2].y + 2 * cpos[3].y ) < threshold )
    {
      split_cubic( cpos );
      goto Append;
    }

    split_cubic( cpos );

    /* If max number of splits is done */
    /* then stop and add the lines to  */
    /* the list.                       */
    if ( max_splits <= 2 )
      goto Append;

    /* Otherwise keep splitting. */
    FT_CALL( split_sdf_cubic( memory, &cpos[0], max_splits / 2, out ) );
    FT_CALL( split_sdf_cubic( memory, &cpos[3], max_splits / 2, out ) );

    /* [NOTE]: This is not an efficient way of   */
    /* splitting the curve.  Check the deviation */
    /* instead and stop if the deviation is less */
    /* than a pixel.                             */

    goto Exit;

  Append:
    /* Do allocation and add the lines to the list. */

    FT_CALL( sdf_edge_new( memory, &left) );
    FT_CALL( sdf_edge_new( memory, &right) );

    left->start_pos  = cpos[0];
    left->end_pos    = cpos[3];
    left->edge_type  = SDF_EDGE_LINE;

    right->start_pos = cpos[3];
    right->end_pos   = cpos[6];
    right->edge_type = SDF_EDGE_LINE;

    left->next  = right;
    right->next = (*out);
    *out        = left;

  Exit:
    return error;
  }